

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O1

void __thiscall JAMA::Eigenvalue<double>::tred2(Eigenvalue<double> *this)

{
  int iVar1;
  pointer pdVar2;
  double *pdVar3;
  double **ppdVar4;
  double *pdVar5;
  pointer pdVar6;
  int j_2;
  int k;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int k_3;
  long lVar10;
  long lVar11;
  int j;
  int j_4;
  ulong uVar12;
  int k_2;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  iVar1 = this->n;
  lVar14 = (long)iVar1;
  if (0 < lVar14) {
    pdVar2 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->V).data_[iVar1 - 1];
    lVar8 = 0;
    do {
      pdVar2[lVar8] = pdVar3[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar14 != lVar8);
  }
  if (1 < iVar1) {
    uVar12 = (ulong)(iVar1 - 1);
    uVar13 = 0;
    uVar15 = uVar12;
    do {
      lVar8 = lVar14 + -1;
      uVar7 = 0;
      dVar18 = 0.0;
      do {
        dVar18 = dVar18 + ABS((this->d).data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar7]);
        uVar7 = uVar7 + 1;
      } while (uVar15 != uVar7);
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        pdVar2 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar19 = 0.0;
        uVar7 = 0;
        do {
          dVar16 = pdVar2[uVar7] / dVar18;
          pdVar2[uVar7] = dVar16;
          dVar19 = dVar19 + dVar16 * dVar16;
          uVar7 = uVar7 + 1;
        } while (uVar15 != uVar7);
        dVar16 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar14 + -2];
        if (dVar19 < 0.0) {
          dVar17 = sqrt(dVar19);
        }
        else {
          dVar17 = SQRT(dVar19);
        }
        lVar10 = lVar14 + -2;
        dVar17 = (double)(~-(ulong)(0.0 < dVar16) & (ulong)dVar17 |
                         (ulong)-dVar17 & -(ulong)(0.0 < dVar16));
        pdVar2 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2[lVar8] = dVar18 * dVar17;
        dVar19 = dVar19 - dVar16 * dVar17;
        pdVar6 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6[lVar14 + -2] = dVar16 - dVar17;
        memset(pdVar2,0,(uVar12 - uVar13) * 8);
        ppdVar4 = (this->V).data_;
        uVar7 = 0;
        do {
          dVar18 = pdVar6[uVar7];
          pdVar3 = ppdVar4[uVar7];
          pdVar3[lVar8] = dVar18;
          dVar16 = pdVar3[uVar7] * dVar18 + pdVar2[uVar7];
          for (uVar9 = uVar7; (long)uVar9 < lVar10; uVar9 = uVar9 + 1) {
            dVar17 = ppdVar4[uVar9 + 1][uVar7];
            dVar16 = dVar16 + pdVar6[uVar9 + 1] * dVar17;
            pdVar2[uVar9 + 1] = dVar17 * dVar18 + pdVar2[uVar9 + 1];
          }
          pdVar2[uVar7] = dVar16;
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar15);
        dVar18 = 0.0;
        uVar7 = 0;
        do {
          dVar16 = pdVar2[uVar7];
          pdVar2[uVar7] = dVar16 / dVar19;
          dVar18 = dVar18 + (dVar16 / dVar19) * pdVar6[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar15 != uVar7);
        uVar7 = 0;
        do {
          pdVar2[uVar7] = pdVar6[uVar7] * (-dVar18 / (dVar19 + dVar19)) + pdVar2[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar15 != uVar7);
        ppdVar4 = (this->V).data_;
        pdVar3 = ppdVar4[lVar14 + -2];
        pdVar5 = ppdVar4[lVar8];
        lVar14 = -1;
        uVar7 = 0;
        do {
          if ((long)uVar7 <= lVar10) {
            dVar18 = pdVar6[uVar7];
            dVar16 = pdVar2[uVar7];
            lVar11 = lVar14;
            do {
              ppdVar4[lVar11 + 1][uVar7] =
                   ppdVar4[lVar11 + 1][uVar7] -
                   (pdVar2[lVar11 + 1] * dVar18 + pdVar6[lVar11 + 1] * dVar16);
              lVar11 = lVar11 + 1;
            } while (lVar11 < lVar10);
          }
          pdVar6[uVar7] = pdVar3[uVar7];
          pdVar5[uVar7] = 0.0;
          uVar7 = uVar7 + 1;
          lVar14 = lVar14 + 1;
        } while (uVar7 != uVar15);
      }
      else {
        pdVar2 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] = pdVar2[lVar14 + -2];
        ppdVar4 = (this->V).data_;
        pdVar3 = ppdVar4[lVar14 + -2];
        pdVar5 = ppdVar4[lVar8];
        uVar7 = 0;
        do {
          pdVar2[uVar7] = pdVar3[uVar7];
          pdVar5[uVar7] = 0.0;
          ppdVar4[uVar7][lVar8] = 0.0;
          uVar7 = uVar7 + 1;
        } while (uVar15 != uVar7);
        dVar19 = 0.0;
      }
      (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8] = dVar19;
      uVar15 = uVar15 - 1;
      uVar13 = uVar13 + 1;
      lVar14 = lVar8;
    } while (uVar13 != uVar12);
  }
  iVar1 = this->n;
  uVar15 = (ulong)(iVar1 - 1);
  if (1 < (long)iVar1) {
    pdVar2 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppdVar4 = (this->V).data_;
    pdVar3 = ppdVar4[uVar15];
    lVar14 = 1;
    uVar12 = 0;
    do {
      pdVar5 = ppdVar4[uVar12];
      pdVar3[uVar12] = pdVar5[uVar12];
      pdVar5[uVar12] = 1.0;
      dVar18 = pdVar2[uVar12 + 1];
      uVar12 = uVar12 + 1;
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        lVar8 = 0;
        do {
          pdVar2[lVar8] = ppdVar4[lVar8][uVar12] / dVar18;
          lVar8 = lVar8 + 1;
        } while (lVar14 != lVar8);
        lVar8 = 0;
        do {
          dVar18 = 0.0;
          lVar10 = 0;
          do {
            dVar18 = dVar18 + ppdVar4[lVar10][uVar12] * ppdVar4[lVar10][lVar8];
            lVar10 = lVar10 + 1;
          } while (lVar14 != lVar10);
          lVar10 = 0;
          do {
            ppdVar4[lVar10][lVar8] = pdVar2[lVar10] * -dVar18 + ppdVar4[lVar10][lVar8];
            lVar10 = lVar10 + 1;
          } while (lVar14 != lVar10);
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar14);
      }
      lVar8 = 0;
      do {
        ppdVar4[lVar8][uVar12] = 0.0;
        lVar8 = lVar8 + 1;
      } while (lVar14 != lVar8);
      lVar14 = lVar14 + 1;
    } while (uVar12 != uVar15);
  }
  if (0 < iVar1) {
    pdVar2 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->V).data_[uVar15];
    lVar14 = 0;
    do {
      pdVar2[lVar14] = pdVar3[lVar14];
      pdVar3[lVar14] = 0.0;
      lVar14 = lVar14 + 1;
    } while (iVar1 != lVar14);
  }
  (this->V).data_[uVar15][uVar15] = 1.0;
  *(this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = 0.0;
  return;
}

Assistant:

void tred2() {
      //  This is derived from the Algol procedures tred2 by
      //  Bowdler, Martin, Reinsch, and Wilkinson, Handbook for
      //  Auto. Comp., Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      for (int j = 0; j < n; j++) {
        d(j) = V(n - 1, j);
      }

      // Householder reduction to tridiagonal form.

      for (int i = n - 1; i > 0; i--) {
        // Scale to avoid under/overflow.

        Real scale = 0.0;
        Real h     = 0.0;
        for (int k = 0; k < i; k++) {
          scale = scale + abs(d(k));
        }
        if (scale == 0.0) {
          e(i) = d(i - 1);
          for (int j = 0; j < i; j++) {
            d(j)    = V(i - 1, j);
            V(i, j) = 0.0;
            V(j, i) = 0.0;
          }
        } else {
          // Generate Householder vector.

          for (int k = 0; k < i; k++) {
            d(k) /= scale;
            h += d(k) * d(k);
          }
          Real f = d(i - 1);
          Real g = sqrt(h);
          if (f > 0) { g = -g; }
          e(i)     = scale * g;
          h        = h - f * g;
          d(i - 1) = f - g;
          for (int j = 0; j < i; j++) {
            e(j) = 0.0;
          }

          // Apply similarity transformation to remaining columns.

          for (int j = 0; j < i; j++) {
            f       = d(j);
            V(j, i) = f;
            g       = e(j) + V(j, j) * f;
            for (int k = j + 1; k <= i - 1; k++) {
              g += V(k, j) * d(k);
              e(k) += V(k, j) * f;
            }
            e(j) = g;
          }
          f = 0.0;
          for (int j = 0; j < i; j++) {
            e(j) /= h;
            f += e(j) * d(j);
          }
          Real hh = f / (h + h);
          for (int j = 0; j < i; j++) {
            e(j) -= hh * d(j);
          }
          for (int j = 0; j < i; j++) {
            f = d(j);
            g = e(j);
            for (int k = j; k <= i - 1; k++) {
              V(k, j) -= (f * e(k) + g * d(k));
            }
            d(j)    = V(i - 1, j);
            V(i, j) = 0.0;
          }
        }
        d(i) = h;
      }

      // Accumulate transformations.

      for (int i = 0; i < n - 1; i++) {
        V(n - 1, i) = V(i, i);
        V(i, i)     = 1.0;
        Real h      = d(i + 1);
        if (h != 0.0) {
          for (int k = 0; k <= i; k++) {
            d(k) = V(k, i + 1) / h;
          }
          for (int j = 0; j <= i; j++) {
            Real g = 0.0;
            for (int k = 0; k <= i; k++) {
              g += V(k, i + 1) * V(k, j);
            }
            for (int k = 0; k <= i; k++) {
              V(k, j) -= g * d(k);
            }
          }
        }
        for (int k = 0; k <= i; k++) {
          V(k, i + 1) = 0.0;
        }
      }
      for (int j = 0; j < n; j++) {
        d(j)        = V(n - 1, j);
        V(n - 1, j) = 0.0;
      }
      V(n - 1, n - 1) = 1.0;
      e(0)            = 0.0;
    }